

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O0

float getRecordingPercentage(void)

{
  bool bVar1;
  float local_24;
  float local_10;
  float local_c;
  
  if ((sec) || (bVar1 = recordingPipe(), bVar1)) {
    local_c = (sec_head - sec_start) / (sec_end - sec_start);
  }
  else if ((frame & 1U) == 0) {
    local_c = 1.0;
  }
  else {
    local_10 = (float)(frame_head - frame_start);
    local_24 = (float)(frame_end - frame_start);
    local_c = local_10 / local_24;
  }
  return local_c;
}

Assistant:

float getRecordingPercentage() {
    if (sec || recordingPipe() )
        return ((sec_head - sec_start) / (sec_end - sec_start));
    else if (frame)
        return ( (float)(frame_head - frame_start) / (float)(frame_end - frame_start));
    else 
        return 1.0;
}